

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_0::ClearAttachmentTestInstance::iterate
          (TestStatus *__return_storage_ptr__,ClearAttachmentTestInstance *this)

{
  TestParams_conflict *pTVar1;
  DeviceInterface *pDVar2;
  VkExtent2D VVar3;
  bool bVar4;
  VkResult VVar5;
  undefined8 uVar6;
  VkAccessFlags dstAccessMask;
  VkClearValue clearValue;
  vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_> clearRects;
  VkClearRect rects [2];
  VkClearAttachment clearAttachment;
  void *local_98;
  iterator iStack_90;
  VkClearRect *local_88;
  UVec4 local_78;
  undefined1 local_68 [32];
  uint uStack_48;
  uint uStack_44;
  undefined8 local_40;
  VkImageAspectFlags local_38 [2];
  VkClearDepthStencilValue local_30;
  undefined8 uStack_28;
  
  local_38[0] = (this->super_ImageClearingTestInstance).m_imageAspectFlags;
  local_38[1] = 0;
  pTVar1 = (this->super_ImageClearingTestInstance).m_params;
  local_30 = pTVar1->clearValue[0].depthStencil;
  uStack_28 = *(undefined8 *)((long)pTVar1->clearValue + 8);
  local_78.m_data[0] = 0;
  local_78.m_data[1] = 0;
  local_78.m_data[2] = 0;
  local_78.m_data[3] = 0;
  local_98 = (void *)0x0;
  iStack_90._M_current = (VkClearRect *)0x0;
  local_88 = (VkClearRect *)0x0;
  if (this->m_clearType == FULL_CLEAR) {
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    local_68._8_4_ = (pTVar1->imageExtent).width;
    local_68._12_4_ = (pTVar1->imageExtent).height;
    local_68._16_8_ = 0x100000000;
    std::vector<vk::VkClearRect,std::allocator<vk::VkClearRect>>::
    _M_realloc_insert<vk::VkClearRect_const&>
              ((vector<vk::VkClearRect,std::allocator<vk::VkClearRect>> *)&local_98,(iterator)0x0,
               (VkClearRect *)local_68);
  }
  else {
    local_68._8_4_ = (pTVar1->imageExtent).width;
    uStack_44 = (pTVar1->imageExtent).height;
    local_78.m_data[1] = uStack_44 >> 2;
    local_68._0_8_ = (ulong)local_78.m_data[1] << 0x20;
    local_78.m_data[0] = (uint)local_68._8_4_ >> 2;
    uStack_48 = (uint)local_68._8_4_ >> 1;
    local_78.m_data[3] = local_78.m_data[1] + (uStack_44 >> 1);
    local_78.m_data[2] = local_78.m_data[0] + uStack_48;
    local_68._12_4_ = uStack_44 >> 1;
    local_68._16_8_ = 0x100000000;
    local_68._28_4_ = 0;
    local_68._24_4_ = local_78.m_data[0];
    local_40 = 0x100000000;
    std::vector<vk::VkClearRect,std::allocator<vk::VkClearRect>>::
    _M_realloc_insert<vk::VkClearRect_const&>
              ((vector<vk::VkClearRect,std::allocator<vk::VkClearRect>> *)&local_98,(iterator)0x0,
               (VkClearRect *)local_68);
    if (iStack_90._M_current == local_88) {
      std::vector<vk::VkClearRect,std::allocator<vk::VkClearRect>>::
      _M_realloc_insert<vk::VkClearRect_const&>
                ((vector<vk::VkClearRect,std::allocator<vk::VkClearRect>> *)&local_98,iStack_90,
                 (VkClearRect *)(local_68 + 0x18));
    }
    else {
      (iStack_90._M_current)->baseArrayLayer = (undefined4)local_40;
      (iStack_90._M_current)->layerCount = local_40._4_4_;
      VVar3.height = uStack_44;
      VVar3.width = uStack_48;
      ((iStack_90._M_current)->rect).offset.x = local_68._24_4_;
      ((iStack_90._M_current)->rect).offset.y = local_68._28_4_;
      ((iStack_90._M_current)->rect).extent = VVar3;
      iStack_90._M_current = iStack_90._M_current + 1;
    }
  }
  bVar4 = ::vk::isDepthStencilFormat
                    (((this->super_ImageClearingTestInstance).m_params)->imageFormat);
  dstAccessMask = 0x100;
  if (bVar4) {
    dstAccessMask = 0x400;
  }
  pDVar2 = (this->super_ImageClearingTestInstance).m_vkd;
  local_68._8_4_ = 0;
  local_68._12_4_ = 0;
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  local_68._0_4_ = 0x2a;
  local_68._4_4_ = 0;
  VVar5 = (*pDVar2->_vptr_DeviceInterface[0x49])
                    (pDVar2,(this->super_ImageClearingTestInstance).m_commandBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar5,"m_vkd.beginCommandBuffer(*m_commandBuffer, &commandBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiImageClearingTests.cpp"
                    ,0x2b1);
  uVar6 = 0;
  ImageClearingTestInstance::pipelineImageBarrier
            (&this->super_ImageClearingTestInstance,1,0x10000,0,dstAccessMask,
             VK_IMAGE_LAYOUT_UNDEFINED,bVar4 | VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);
  pTVar1 = (this->super_ImageClearingTestInstance).m_params;
  clearValue._8_8_ = uVar6;
  clearValue.depthStencil = (VkClearDepthStencilValue)*(undefined8 *)((long)&pTVar1->initValue + 8);
  ImageClearingTestInstance::beginRenderPass
            (&this->super_ImageClearingTestInstance,
             (VkSubpassContents)(pTVar1->initValue).depthStencil.depth,clearValue);
  pDVar2 = (this->super_ImageClearingTestInstance).m_vkd;
  (*pDVar2->_vptr_DeviceInterface[0x68])
            (pDVar2,(this->super_ImageClearingTestInstance).m_commandBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,local_38,
             (ulong)(uint)((int)((ulong)((long)iStack_90._M_current - (long)local_98) >> 3) *
                          -0x55555555));
  pDVar2 = (this->super_ImageClearingTestInstance).m_vkd;
  (*pDVar2->_vptr_DeviceInterface[0x76])
            (pDVar2,(this->super_ImageClearingTestInstance).m_commandBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ImageClearingTestInstance::pipelineImageBarrier
            (&this->super_ImageClearingTestInstance,0x8000,0x1000,dstAccessMask,0x800,
             bVar4 | VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_GENERAL);
  pDVar2 = (this->super_ImageClearingTestInstance).m_vkd;
  VVar5 = (*pDVar2->_vptr_DeviceInterface[0x4a])
                    (pDVar2,(this->super_ImageClearingTestInstance).m_commandBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar5,"m_vkd.endCommandBuffer(*m_commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiImageClearingTests.cpp"
                    ,0x2b6);
  ImageClearingTestInstance::submitCommandBuffer(&this->super_ImageClearingTestInstance);
  local_68._0_8_ = (long)local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"cmdClearAttachments passed","");
  ImageClearingTestInstance::verifyResultImage
            (__return_storage_ptr__,&this->super_ImageClearingTestInstance,(string *)local_68,
             &local_78);
  if (local_68._0_8_ != (long)local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if (local_98 != (void *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

TestStatus iterate (void)
	{
		const VkClearAttachment clearAttachment =
		{
			m_imageAspectFlags,					// VkImageAspectFlags	aspectMask;
			0u,									// deUint32				colorAttachment;
			m_params.clearValue[0]				// VkClearValue			clearValue;
		};

		UVec4						clearCoords;
		std::vector<VkClearRect>	clearRects;

		if (m_clearType == FULL_CLEAR)
		{
			const VkClearRect rect =
			{
				{
					{ 0, 0 },																	// VkOffset2D    offset;
					{ m_params.imageExtent.width, m_params.imageExtent.height }					// VkExtent2D    extent;
				},																			// VkRect2D	rect;
				0u,																			// deUint32	baseArrayLayer;
				1u																			// deUint32	layerCount;
			};

			clearRects.push_back(rect);
		}
		else
		{
			const deUint32	clearX		= m_params.imageExtent.width  / 4u;
			const deUint32	clearY		= m_params.imageExtent.height / 4u;
			const deUint32	clearWidth	= m_params.imageExtent.width  / 2u;
			const deUint32	clearHeight	= m_params.imageExtent.height / 2u;

			clearCoords	= UVec4(clearX,					clearY,
								clearX + clearWidth,	clearY + clearHeight);

			const VkClearRect rects[2] =
			{
				{
					{
						{ 0,							static_cast<deInt32>(clearY)	},		// VkOffset2D    offset;
						{ m_params.imageExtent.width,	clearHeight						}		// VkExtent2D    extent;
					},																		// VkRect2D	rect;
					0u,																		// deUint32	baseArrayLayer;
					1u																		// deUint32	layerCount;
				},
				{
					{
						{ static_cast<deInt32>(clearX),	0							},			// VkOffset2D    offset;
						{ clearWidth,					m_params.imageExtent.height	}			// VkExtent2D    extent;
					},																		// VkRect2D	rect;
					0u,																		// deUint32	baseArrayLayer;
					1u																		// deUint32	layerCount;
				}
			};

			clearRects.push_back(rects[0]);
			clearRects.push_back(rects[1]);
		}

		const bool			isDepthStencil		= isDepthStencilFormat(m_params.imageFormat);
		const VkAccessFlags	accessMask			= (isDepthStencil ? VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT     : VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
		const VkImageLayout	attachmentLayout	= (isDepthStencil ? VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL : VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);

		beginCommandBuffer(0);

		pipelineImageBarrier(VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT,				// VkPipelineStageFlags		srcStageMask
							 VK_PIPELINE_STAGE_ALL_COMMANDS_BIT,			// VkPipelineStageFlags		dstStageMask
							 0,												// VkAccessFlags			srcAccessMask
							 accessMask,									// VkAccessFlags			dstAccessMask
							 VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
							 attachmentLayout);								// VkImageLayout			newLayout;

		beginRenderPass(VK_SUBPASS_CONTENTS_INLINE, m_params.initValue);
		m_vkd.cmdClearAttachments(*m_commandBuffer, 1, &clearAttachment, static_cast<deUint32>(clearRects.size()), &clearRects[0]);
		m_vkd.cmdEndRenderPass(*m_commandBuffer);

		pipelineImageBarrier(VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT,			// VkPipelineStageFlags		srcStageMask
							 VK_PIPELINE_STAGE_TRANSFER_BIT,				// VkPipelineStageFlags		dstStageMask
							 accessMask,									// VkAccessFlags			srcAccessMask
							 VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags			dstAccessMask
							 attachmentLayout,								// VkImageLayout			oldLayout;
							 VK_IMAGE_LAYOUT_GENERAL);						// VkImageLayout			newLayout;

		endCommandBuffer();
		submitCommandBuffer();

		return verifyResultImage("cmdClearAttachments passed", clearCoords);
	}